

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getLinearAngularMomentumJacobian
          (KinDynComputations *this,MatrixView<double> *linAngMomentumJacobian)

{
  long lVar1;
  long lVar2;
  Index col;
  long lVar3;
  long lVar4;
  long lVar5;
  Index row;
  long lVar6;
  pointer peVar7;
  pointer peVar8;
  bool bVar9;
  MatrixView<double> local_90;
  MatrixView<double> local_60;
  
  if (linAngMomentumJacobian->m_rows == 6) {
    lVar4 = linAngMomentumJacobian->m_cols;
    lVar1 = iDynTree::Model::getNrOfDOFs();
    bVar9 = lVar4 == lVar1 + 6;
  }
  else {
    bVar9 = false;
  }
  if (bVar9 == false) {
    iDynTree::reportError
              ("KinDynComputations","getLinearAngularMomentumJacobian",
               "Wrong size in input linAngMomentumJacobian");
  }
  else {
    computeRawMassMatrixAndTotalMomentum(this);
    lVar1 = iDynTree::MatrixDynSize::data();
    iDynTree::MatrixDynSize::rows();
    lVar2 = iDynTree::MatrixDynSize::cols();
    iDynTree::Model::getNrOfDOFs();
    local_60.m_storageOrder = linAngMomentumJacobian->m_storageOrder;
    local_60.m_storage = linAngMomentumJacobian->m_storage;
    local_60.m_rows = linAngMomentumJacobian->m_rows;
    lVar4 = 1;
    if (local_60.m_storageOrder == ColumnMajor) {
      lVar4 = local_60.m_rows;
    }
    local_60.m_cols = linAngMomentumJacobian->m_cols;
    lVar5 = local_60.m_cols;
    if (local_60.m_storageOrder == ColumnMajor) {
      lVar5 = 1;
    }
    if (0 < local_60.m_rows) {
      lVar6 = 0;
      peVar7 = local_60.m_storage;
      do {
        if (0 < local_60.m_cols) {
          lVar3 = 0;
          peVar8 = peVar7;
          do {
            *peVar8 = *(element_type *)(lVar1 + lVar3 * 8);
            lVar3 = lVar3 + 1;
            peVar8 = peVar8 + lVar4;
          } while (local_60.m_cols != lVar3);
        }
        lVar6 = lVar6 + 1;
        lVar1 = lVar1 + lVar2 * 8;
        peVar7 = peVar7 + lVar5;
      } while (lVar6 != local_60.m_rows);
    }
    local_60.m_innerStride = linAngMomentumJacobian->m_innerStride;
    local_60.m_outerStride = linAngMomentumJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnRightSideMatrixExpectingBodyFixedModelVelocity
              (this->pimpl,&local_60);
    local_90.m_storage = linAngMomentumJacobian->m_storage;
    local_90.m_rows = linAngMomentumJacobian->m_rows;
    local_90.m_cols = linAngMomentumJacobian->m_cols;
    local_90.m_storageOrder = linAngMomentumJacobian->m_storageOrder;
    local_90.m_innerStride = linAngMomentumJacobian->m_innerStride;
    local_90.m_outerStride = linAngMomentumJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedBaseMomentumJacobian
              (this->pimpl,&local_90);
  }
  return bVar9;
}

Assistant:

bool KinDynComputations::getLinearAngularMomentumJacobian(MatrixView<double> linAngMomentumJacobian)
{
    bool ok = (linAngMomentumJacobian.rows() == 6)
        && (linAngMomentumJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getLinearAngularMomentumJacobian",
                    "Wrong size in input linAngMomentumJacobian");
        return false;
    }

    this->computeRawMassMatrixAndTotalMomentum();

    toEigen(linAngMomentumJacobian) = toEigen(pimpl->m_rawMassMatrix).block(0,0,6,6+pimpl->m_robot_model.getNrOfDOFs());

    // Handle the different representations
    pimpl->processOnRightSideMatrixExpectingBodyFixedModelVelocity(linAngMomentumJacobian);
    pimpl->processOnLeftSideBodyFixedBaseMomentumJacobian(linAngMomentumJacobian);

    return true;
}